

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O2

OPJ_BOOL opj_sparse_array_int32_write
                   (opj_sparse_array_int32_t *sa,OPJ_UINT32 x0,OPJ_UINT32 y0,OPJ_UINT32 x1,
                   OPJ_UINT32 y1,OPJ_INT32 *src,OPJ_UINT32 src_col_stride,OPJ_UINT32 src_line_stride
                   ,OPJ_BOOL forgiving)

{
  OPJ_BOOL OVar1;
  
  OVar1 = opj_sparse_array_int32_read_or_write
                    (sa,x0,y0,x1,y1,src,src_col_stride,src_line_stride,forgiving,0);
  return OVar1;
}

Assistant:

OPJ_BOOL opj_sparse_array_int32_write(opj_sparse_array_int32_t* sa,
                                      OPJ_UINT32 x0,
                                      OPJ_UINT32 y0,
                                      OPJ_UINT32 x1,
                                      OPJ_UINT32 y1,
                                      const OPJ_INT32* src,
                                      OPJ_UINT32 src_col_stride,
                                      OPJ_UINT32 src_line_stride,
                                      OPJ_BOOL forgiving)
{
    return opj_sparse_array_int32_read_or_write(sa, x0, y0, x1, y1,
            (OPJ_INT32*)src,
            src_col_stride,
            src_line_stride,
            forgiving,
            OPJ_FALSE);
}